

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::MaybeEmitHaswordsCheck
               (ChunkIterator it,ChunkIterator end,Options *options,
               vector<int,_std::allocator<int>_> *has_bit_indices,int cached_has_word_index,
               string *from,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  bool bVar2;
  pointer pFVar3;
  difference_type dVar4;
  reference ppFVar5;
  Sub *local_248;
  basic_string_view<char,_std::char_traits<char>_> local_200;
  undefined1 local_1e9;
  anon_class_32_4_e4330850_for_cb local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  Sub *local_1a0;
  Sub local_198;
  iterator local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_d0 [2];
  undefined8 local_b0;
  value_type local_a4 [2];
  Options *local_90;
  undefined1 local_88 [16];
  ChunkIterator next;
  vector<HasWordMask,_std::allocator<HasWordMask>_> hasword_masks;
  anon_class_8_1_fb1165f6 is_same_hasword;
  anon_class_8_1_25a84e30 hasbit_word;
  string *from_local;
  vector<int,_std::allocator<int>_> *pvStack_30;
  int cached_has_word_index_local;
  vector<int,_std::allocator<int>_> *has_bit_indices_local;
  Options *options_local;
  ChunkIterator end_local;
  ChunkIterator it_local;
  
  from_local._4_4_ = cached_has_word_index;
  pvStack_30 = has_bit_indices;
  has_bit_indices_local = (vector<int,_std::allocator<int>_> *)options;
  options_local = (Options *)end._M_current;
  end_local = it;
  pFVar3 = __gnu_cxx::
           __normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
           ::operator->(&end_local);
  if (((((pFVar3->has_hasbit & 1U) == 0) ||
       (bVar2 = IsProfileDriven((Options *)has_bit_indices_local), !bVar2)) ||
      (dVar4 = std::
               distance<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldChunk*,std::vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>>>
                         ((__normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
                           )end_local._M_current,
                          (__normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
                           )options_local), dVar4 < 2)) ||
     (pFVar3 = __gnu_cxx::
               __normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
               ::operator->(&end_local), (pFVar3->is_rarely_present & 1U) == 0)) {
    it_local._M_current._7_1_ = false;
  }
  else {
    is_same_hasword.hasbit_word = (anon_class_8_1_25a84e30 *)pvStack_30;
    hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&is_same_hasword;
    std::vector<HasWordMask,_std::allocator<HasWordMask>_>::vector
              ((vector<HasWordMask,_std::allocator<HasWordMask>_> *)&next);
    while (bVar2 = __gnu_cxx::operator!=
                             (&end_local,
                              (__normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
                               *)&options_local), bVar2) {
      local_88._0_8_ = end_local._M_current;
      local_90 = options_local;
      local_88._8_8_ =
           FindNextUnequalChunk<google::protobuf::compiler::cpp::(anonymous_namespace)::MaybeEmitHaswordsCheck(__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldChunk*,std::vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>>,__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldChunk*,std::vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>>,google::protobuf::compiler::cpp::Options_const&,std::vector<int,std::allocator<int>>const&,int,std::__cxx11::string_const&,google::protobuf::io::Printer*)::__0>
                     (end_local,(ChunkIterator)options_local,
                      (anon_class_8_1_fb1165f6 *)
                      &hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      while (bVar2 = __gnu_cxx::operator!=
                               (&end_local,
                                (__normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
                                 *)(local_88 + 8)), bVar2) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
                 ::operator->(&end_local);
        bVar2 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::empty(&pFVar3->fields);
        if (!bVar2) {
          pFVar3 = __gnu_cxx::
                   __normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
                   ::operator->(&end_local);
          ppFVar5 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::front(&pFVar3->fields);
          local_a4[0].word =
               MaybeEmitHaswordsCheck::anon_class_8_1_25a84e30::operator()
                         ((anon_class_8_1_25a84e30 *)&is_same_hasword,*ppFVar5);
          local_b0 = end_local._M_current;
          local_d0[1]._8_8_ = local_88._8_8_;
          local_a4[0].mask = GenChunkMask(end_local,(ChunkIterator)local_88._8_8_,pvStack_30);
          std::vector<HasWordMask,_std::allocator<HasWordMask>_>::push_back
                    ((vector<HasWordMask,_std::allocator<HasWordMask>_> *)&next,local_a4);
          break;
        }
        __gnu_cxx::
        __normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
        ::operator++(&end_local);
      }
      end_local._M_current = (FieldChunk *)local_88._8_8_;
    }
    bVar2 = std::vector<HasWordMask,_std::allocator<HasWordMask>_>::empty
                      ((vector<HasWordMask,_std::allocator<HasWordMask>_> *)&next);
    pPVar1 = p;
    if (bVar2) {
      it_local._M_current._7_1_ = false;
    }
    else {
      local_1e9 = 1;
      local_1a0 = &local_198;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"cond",&local_1c1);
      local_1e8.hasword_masks = (vector<HasWordMask,_std::allocator<HasWordMask>_> *)&next;
      local_1e8.p = &p;
      local_1e8.cached_has_word_index = (int *)((long)&from_local + 4);
      local_1e8.from = from;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::MaybeEmitHaswordsCheck(__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldChunk*,std::vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>>,__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldChunk*,std::vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>>,google::protobuf::compiler::cpp::Options_const&,std::vector<int,std::allocator<int>>const&,int,std::__cxx11::string_const&,google::protobuf::io::Printer*)::__1>
                (&local_198,&local_1c0,&local_1e8);
      local_1e9 = 0;
      local_e0 = &local_198;
      local_d8 = 1;
      v._M_len = 1;
      v._M_array = local_e0;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_d0[0]._M_local_buf,v);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_200,"\n            if (ABSL_PREDICT_FALSE($cond$)) {\n          ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit
                (pPVar1,local_d0[0]._M_allocated_capacity,local_d0[0]._8_8_,local_200._M_len,
                 local_200._M_str);
      local_248 = (Sub *)&local_e0;
      do {
        local_248 = local_248 + -1;
        protobuf::io::Printer::Sub::~Sub(local_248);
      } while (local_248 != &local_198);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      protobuf::io::Printer::Indent(p);
      it_local._M_current._7_1_ = true;
    }
    local_d0[1]._4_4_ = 1;
    std::vector<HasWordMask,_std::allocator<HasWordMask>_>::~vector
              ((vector<HasWordMask,_std::allocator<HasWordMask>_> *)&next);
  }
  return it_local._M_current._7_1_;
}

Assistant:

bool MaybeEmitHaswordsCheck(ChunkIterator it, ChunkIterator end,
                            const Options& options,
                            const std::vector<int>& has_bit_indices,
                            int cached_has_word_index, const std::string& from,
                            io::Printer* p) {
  if (!it->has_hasbit || !IsProfileDriven(options) ||
      std::distance(it, end) < 2 || !it->is_rarely_present) {
    return false;
  }

  auto hasbit_word = [&has_bit_indices](const FieldDescriptor* field) {
    return has_bit_indices[field->index()] / 32;
  };
  auto is_same_hasword = [&](const FieldChunk& a, const FieldChunk& b) {
    // Empty fields are assumed to have the same haswords.
    if (a.fields.empty() || b.fields.empty()) return true;

    return hasbit_word(a.fields.front()) == hasbit_word(b.fields.front());
  };

  struct HasWordMask {
    int word;
    uint32_t mask;
  };

  std::vector<HasWordMask> hasword_masks;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, is_same_hasword);
    for (; it != next; ++it) {
      if (!it->fields.empty()) {
        hasword_masks.push_back({hasbit_word(it->fields.front()),
                                 GenChunkMask(it, next, has_bit_indices)});
        break;
      }
    }
    // Jump to the next batch instead.
    it = next;
  }

  if (hasword_masks.empty()) return false;

  // Emit has_bit check for each has_bit_dword index.
  p->Emit({{"cond",
            [&] {
              int first_word = hasword_masks.front().word;
              for (const auto& m : hasword_masks) {
                uint32_t mask = m.mask;
                int this_word = m.word;
                if (this_word != first_word) {
                  p->Emit(R"cc(
                    ||
                  )cc");
                }
                auto v =
                    p->WithVars({{"mask", absl::StrFormat("0x%08xu", mask)}});
                if (this_word == cached_has_word_index) {
                  p->Emit("(cached_has_bits & $mask$) != 0");
                } else {
                  p->Emit({{"from", from}, {"word", this_word}},
                          "($from$_impl_._has_bits_[$word$] & $mask$) != 0");
                }
              }
            }}},
          R"cc(
            if (ABSL_PREDICT_FALSE($cond$)) {
          )cc");
  p->Indent();
  return true;
}